

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcSampleVariablesTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::SampleShadingMaskCase::iterate(SampleShadingMaskCase *this)

{
  string *sampler;
  int *piVar1;
  pointer pVVar2;
  uint *puVar3;
  GLenum GVar4;
  ChannelOrder CVar5;
  ChannelType CVar6;
  TestLog *log;
  RenderContext *pRVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  undefined4 uVar12;
  deUint32 dVar13;
  int iVar14;
  undefined4 extraout_var;
  TestError *pTVar16;
  char *pcVar17;
  uint i;
  uint uVar18;
  code *pcVar19;
  ulong uVar20;
  SampleShadingMaskCase *pSVar21;
  TestContext *this_00;
  uint uVar22;
  byte bVar23;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  long local_2f0;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  string *local_2e0;
  vector<int,_std::allocator<int>_> data;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> result;
  GLuint fbo;
  GLuint rbo;
  GLuint tex;
  GLint maxSamples;
  string *local_280;
  ulong local_278;
  TestLog *local_270;
  SampleShadingMaskCase *local_268;
  undefined4 local_260;
  GLuint fboMs;
  undefined1 local_258 [32];
  string local_238;
  string local_218;
  string local_1f8;
  PixelBufferAccess pixels;
  TextureLevel results;
  deUint32 local_70;
  bool local_48;
  long lVar15;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar10);
  if ((this->m_glslVersion != GLSL_VERSION_310_ES) ||
     (bVar9 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_sample_variables"
                        ), bVar9)) {
    uVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if (((uVar11 & 0x300) == 0x100) ||
       (bVar9 = glu::ContextInfo::isExtensionSupported
                          (((this->super_TestCase).m_context)->m_contextInfo,
                           "GL_EXT_color_buffer_float"), bVar9)) {
      GVar4 = this->m_internalFormat;
    }
    else {
      bVar9 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_ARB_color_buffer_float");
      GVar4 = this->m_internalFormat;
      if (GVar4 == 0x8814 && !bVar9) {
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar17 = "Internalformat rgba32f not supported";
        goto LAB_00d7fbec;
      }
    }
    CVar5 = (this->m_texFormat).order;
    CVar6 = (this->m_texFormat).type;
    if ((CVar6 != HALF_FLOAT || CVar5 != RGBA) &&
        ((CVar5 != R && CVar5 != RG) && CVar5 != RGBA || CVar6 != FLOAT)) {
      if ((CVar6 == UNSIGNED_INT8) || (CVar6 == SIGNED_INT8)) {
        (**(code **)(lVar15 + 0x868))(0x9110,&maxSamples);
        if (this->m_samples <= maxSamples) goto LAB_00d7fbf9;
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar17 = "Test sample count greater than MAX_INTEGER_SAMPLES";
      }
      else {
        (**(code **)(lVar15 + 0x868))(0x8d57,&maxSamples);
        if (this->m_samples <= maxSamples) {
LAB_00d7fbf9:
          (**(code **)(lVar15 + 0x6f8))(1,&tex);
          if (this->m_samples == 0) {
            (**(code **)(lVar15 + 0xb8))(0xde1,tex);
            (**(code **)(lVar15 + 0x1380))(0xde1,1,this->m_internalFormat,0x10,0x10);
            uVar20 = (ulong)(this->m_texFormat).type;
            if (uVar20 < 0x24) {
              uVar12 = 0xde1;
              if ((0x848000000U >> (uVar20 & 0x3f) & 1) != 0) {
                (**(code **)(lVar15 + 0x1360))(0xde1,0x2800,0x2600);
                (**(code **)(lVar15 + 0x1360))(0xde1,0x2801,0x2600);
              }
            }
            else {
              uVar12 = 0xde1;
            }
          }
          else {
            uVar12 = 0x9100;
            (**(code **)(lVar15 + 0xb8))(0x9100);
            (**(code **)(lVar15 + 0x1390))
                      (0x9100,this->m_samples,this->m_internalFormat,0x10,0x10,0);
          }
          (**(code **)(lVar15 + 0x6d0))(1,&fboMs);
          (**(code **)(lVar15 + 0x78))(0x8d40,fboMs);
          (**(code **)(lVar15 + 0x6a0))(0x8d40,0x8ce0,uVar12,tex,0);
          (**(code **)(lVar15 + 0x1a00))(0,0,0x10);
          CVar6 = (this->m_texFormat).type;
          local_260 = uVar12;
          if (CVar6 == UNSIGNED_INT8) {
            results.m_format.order = R;
            results.m_format.type = SNORM_INT16;
            results.m_size.m_data[0] = 0;
            results.m_size.m_data[1] = 1;
            (**(code **)(lVar15 + 0x1b8))(0x1800,0);
          }
          else if (CVar6 == SIGNED_INT8) {
            results.m_format.order = R;
            results.m_format.type = SNORM_INT16;
            results.m_size.m_data[0] = 0;
            results.m_size.m_data[1] = 1;
            (**(code **)(lVar15 + 0x1b0))(0x1800,0);
          }
          else {
            results.m_format.order = R;
            results.m_format.type = 0x3f800000;
            results.m_size.m_data[0] = 0;
            results.m_size.m_data[1] = 0x3f800000;
            (**(code **)(lVar15 + 0x1a8))(0x1800,0);
          }
          pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_258,
                     "${VERSION_DECL}\nin highp vec2 a_position;\nvoid main()\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
                     ,(allocator<char> *)&rbo);
          sampler = &this->m_sampler;
          local_2e0 = &this->m_outType;
          specializeVersion((string *)&data,(string *)local_258,this->m_glslVersion,sampler,
                            local_2e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,
                     (char *)CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._4_4_,
                                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_),
                     (allocator<char> *)&fbo);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_258 + 0x20),
                     "${VERSION_DECL}\n${OES_SV_RQ}layout(location = 0) out highp ${OUT_TYPE} o_color;\nuniform int u_sampleMask;\nvoid main()\n{\n    for (int i = 0; i < (gl_NumSamples + 31) / 32; ++i) {\n        gl_SampleMask[i] = u_sampleMask & gl_SampleMaskIn[i];\n    }\n    o_color = ${OUT_TYPE}(1, 0, 0, 1);\n}\n"
                     ,&local_2f1);
          specializeVersion(&local_218,(string *)(local_258 + 0x20),this->m_glslVersion,sampler,
                            local_2e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,local_218._M_dataplus._M_p,&local_2f2);
          glu::makeVtxFragSources((ProgramSources *)&pixels,(string *)&result,&local_1f8);
          local_2f0 = lVar15;
          glu::ShaderProgram::ShaderProgram
                    ((ShaderProgram *)&results,pRVar7,(ProgramSources *)&pixels);
          glu::ProgramSources::~ProgramSources((ProgramSources *)&pixels);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)(local_258 + 0x20));
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&data);
          std::__cxx11::string::~string((string *)local_258);
          glu::operator<<(log,(ShaderProgram *)&results);
          if (local_48 != false) {
            (**(code **)(local_2f0 + 0x1680))(local_70);
            pcVar19 = *(code **)(local_2f0 + 0x14f0);
            uVar12 = (**(code **)(local_2f0 + 0xb48))(local_70,"u_sampleMask");
            (*pcVar19)(uVar12,this->m_sampleMask);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&result,"a_position",(allocator<char> *)&data);
            glu::va::Float((VertexArrayBinding *)&pixels,(string *)&result,2,4,0,iterate::position);
            lVar15 = local_2f0;
            std::__cxx11::string::~string((string *)&result);
            result.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_600000001;
            result.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
            result.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)iterate::quadIndices;
            glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_70,1,
                      (VertexArrayBinding *)&pixels,(PrimitiveList *)&result,(DrawUtilCallback *)0x0
                     );
            local_280 = sampler;
            local_270 = log;
            dVar13 = (**(code **)(lVar15 + 0x800))();
            glu::checkError(dVar13,"Draw quad",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                            ,0x179);
            std::__cxx11::string::~string((string *)&pixels.super_ConstPixelBufferAccess.m_size);
            glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&results);
            pcVar19 = *(code **)(lVar15 + 0x78);
            iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
            (*pcVar19)(0x8d40,iVar10);
            (**(code **)(lVar15 + 0x440))(1,&fboMs);
            iVar10 = this->m_samples << 4;
            if (this->m_samples == 0) {
              iVar10 = 0x10;
            }
            (**(code **)(lVar15 + 0x6e8))(1,&rbo);
            (**(code **)(lVar15 + 0xa0))(0x8d41,rbo);
            (**(code **)(lVar15 + 0x1238))(0x8d41,this->m_internalFormat,iVar10,0x10);
            local_268 = this;
            (**(code **)(lVar15 + 0x6d0))(1,&fbo);
            pSVar21 = local_268;
            (**(code **)(lVar15 + 0x78))(0x8d40,fbo);
            (**(code **)(lVar15 + 0x688))(0x8d40,0x8ce0,0x8d41,rbo);
            (**(code **)(lVar15 + 0x1a00))(0,0,iVar10,0x10);
            pRVar7 = ((pSVar21->super_TestCase).m_context)->m_renderCtx;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_258,
                       "${VERSION_DECL}\nin highp vec2 a_position;\nvoid main(void)\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
                       ,&local_2f1);
            specializeVersion((string *)&data,(string *)local_258,pSVar21->m_glslVersion,local_280,
                              local_2e0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&result,
                       (char *)CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start._4_4_,
                                        data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start._0_4_),&local_2f2);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_258 + 0x20),
                       "${VERSION_DECL}\nuniform highp ${SAMPLER} u_tex;\nuniform highp ${SAMPLER}MS u_texMS;\nuniform int u_samples;\nlayout(location = 0) out highp ${OUT_TYPE} o_color;\nvoid main(void)\n{\n    if (u_samples > 0) {\n        ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n        int sampleId = int(gl_FragCoord.x) % u_samples;\n        o_color = texelFetch(u_texMS, coord, sampleId);\n    } else {\n        ivec2 coord = ivec2(gl_FragCoord.x, gl_FragCoord.y);\n       o_color = texelFetch(u_tex, coord, 0);\n    }\n}\n"
                       ,&local_2e1);
            specializeVersion(&local_218,(string *)(local_258 + 0x20),pSVar21->m_glslVersion,
                              local_280,local_2e0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f8,local_218._M_dataplus._M_p,&local_2e2);
            glu::makeVtxFragSources((ProgramSources *)&pixels,(string *)&result,&local_1f8);
            glu::ShaderProgram::ShaderProgram
                      ((ShaderProgram *)&results,pRVar7,(ProgramSources *)&pixels);
            glu::ProgramSources::~ProgramSources((ProgramSources *)&pixels);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)(local_258 + 0x20));
            std::__cxx11::string::~string((string *)&result);
            std::__cxx11::string::~string((string *)&data);
            std::__cxx11::string::~string((string *)local_258);
            glu::operator<<(local_270,(ShaderProgram *)&results);
            if (local_48 != false) {
              (**(code **)(local_2f0 + 0x1680))(local_70);
              pcVar19 = *(code **)(local_2f0 + 0x14f0);
              uVar12 = (**(code **)(local_2f0 + 0xb48))(local_70,"u_samples");
              (*pcVar19)(uVar12,pSVar21->m_samples);
              pcVar19 = *(code **)(local_2f0 + 0x14f0);
              bVar9 = pSVar21->m_samples < 1;
              if (bVar9) {
                uVar12 = (**(code **)(local_2f0 + 0xb48))(local_70,"u_tex");
                (*pcVar19)(uVar12,0);
                pcVar19 = *(code **)(local_2f0 + 0x14f0);
                uVar12 = (**(code **)(local_2f0 + 0xb48))(local_70,"u_texMS");
              }
              else {
                uVar12 = (**(code **)(local_2f0 + 0xb48))(local_70,"u_tex");
                (*pcVar19)(uVar12,1);
                pcVar19 = *(code **)(local_2f0 + 0x14f0);
                uVar12 = (**(code **)(local_2f0 + 0xb48))(local_70,"u_texMS");
              }
              (*pcVar19)(uVar12,bVar9);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"a_position",(allocator<char> *)&data);
              glu::va::Float((VertexArrayBinding *)&pixels,(string *)&result,2,4,0,
                             iterate()::position);
              std::__cxx11::string::~string((string *)&result);
              result.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_600000001;
              result.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
              result.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)iterate::quadIndices;
              glu::draw(((pSVar21->super_TestCase).m_context)->m_renderCtx,local_70,1,
                        (VertexArrayBinding *)&pixels,(PrimitiveList *)&result,
                        (DrawUtilCallback *)0x0);
              dVar13 = (**(code **)(local_2f0 + 0x800))();
              glu::checkError(dVar13,"Draw quad",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                              ,0x1ca);
              std::__cxx11::string::~string((string *)&pixels.super_ConstPixelBufferAccess.m_size);
              glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&results);
              tcu::TextureLevel::TextureLevel(&results,&pSVar21->m_texFormat,iVar10,0x10,1);
              tcu::TextureLevel::getAccess(&pixels,&results);
              std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                        (&result,(long)(pixels.super_ConstPixelBufferAccess.m_size.m_data[0] *
                                       pixels.super_ConstPixelBufferAccess.m_size.m_data[1]),
                         (allocator_type *)&data);
              lVar15 = local_2f0;
              if (pixels.super_ConstPixelBufferAccess.m_format.type == UNSIGNED_INT8) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&data,
                           (long)(pixels.super_ConstPixelBufferAccess.m_size.m_data[1] *
                                  pixels.super_ConstPixelBufferAccess.m_size.m_data[0] * 4),
                           (allocator_type *)local_258);
                (**(code **)(lVar15 + 0x1220))
                          (0,0,pixels.super_ConstPixelBufferAccess.m_size.m_data[0],
                           pixels.super_ConstPixelBufferAccess.m_size.m_data[1],0x8d99,0x1405,
                           CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_));
                for (uVar20 = 0;
                    uVar20 < (ulong)(CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                              data.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish._0_4_) -
                                     CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                                              data.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start._0_4_) >> 2);
                    uVar20 = (ulong)((int)uVar20 + 4)) {
                  puVar3 = (uint *)(CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             data.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   uVar20 * 4);
                  uVar11 = puVar3[1];
                  uVar22 = puVar3[2];
                  uVar18 = puVar3[3];
                  pVVar2 = result.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (uVar20 >> 2);
                  pVVar2->m_data[0] =
                       ((float)(*puVar3 >> 0x10 | 0x53000000) - 5.497642e+11) +
                       (float)(*puVar3 & 0xffff | 0x4b000000);
                  pVVar2->m_data[1] =
                       ((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) +
                       (float)(uVar11 & 0xffff | 0x4b000000);
                  pVVar2->m_data[2] =
                       ((float)(uVar22 >> 0x10 | 0x53000000) - 5.497642e+11) +
                       (float)(uVar22 & 0xffff | 0x4b000000);
                  pVVar2->m_data[3] =
                       ((float)(uVar18 >> 0x10 | 0x53000000) - 5.497642e+11) +
                       (float)(uVar18 & 0xffff | 0x4b000000);
                }
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&data);
              }
              else if (pixels.super_ConstPixelBufferAccess.m_format.type == SIGNED_INT8) {
                std::vector<int,_std::allocator<int>_>::vector
                          (&data,(long)(pixels.super_ConstPixelBufferAccess.m_size.m_data[1] *
                                        pixels.super_ConstPixelBufferAccess.m_size.m_data[0] * 4),
                           (allocator_type *)local_258);
                (**(code **)(lVar15 + 0x1220))
                          (0,0,pixels.super_ConstPixelBufferAccess.m_size.m_data[0],
                           pixels.super_ConstPixelBufferAccess.m_size.m_data[1],0x8d99,0x1404,
                           CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_));
                for (uVar20 = 0;
                    uVar20 < (ulong)(CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                              data.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish._0_4_) -
                                     CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                                              data.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start._0_4_) >> 2);
                    uVar20 = (ulong)((int)uVar20 + 4)) {
                  piVar1 = (int *)(CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                                            data.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                  uVar20 * 4);
                  iVar10 = piVar1[1];
                  iVar14 = piVar1[2];
                  iVar8 = piVar1[3];
                  pVVar2 = result.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (uVar20 >> 2);
                  pVVar2->m_data[0] = (float)*piVar1;
                  pVVar2->m_data[1] = (float)iVar10;
                  pVVar2->m_data[2] = (float)iVar14;
                  pVVar2->m_data[3] = (float)iVar8;
                }
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&data.super__Vector_base<int,_std::allocator<int>_>);
              }
              else {
                glu::readPixels(((pSVar21->super_TestCase).m_context)->m_renderCtx,0,0,&pixels);
              }
              bVar23 = 1;
              local_278 = 0;
              for (iVar10 = 0; lVar15 = local_2f0, iVar10 != 0x10; iVar10 = iVar10 + 1) {
                local_2e0 = (string *)CONCAT44(local_2e0._4_4_,iVar10);
                iVar14 = 0;
                while (iVar8 = (int)local_278, iVar14 != 0x10) {
                  uVar22 = pSVar21->m_samples + (uint)(pSVar21->m_samples == 0);
                  local_270 = (TestLog *)CONCAT44(local_270._4_4_,iVar14);
                  local_280 = (string *)(ulong)(uVar22 * iVar14);
                  uVar11 = uVar22;
                  if ((int)uVar22 < 1) {
                    uVar11 = 0;
                  }
                  for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
                    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&data);
                    uVar18 = (uint)uVar20;
                    if ((pixels.super_ConstPixelBufferAccess.m_format.type == UNSIGNED_INT8) ||
                       (pixels.super_ConstPixelBufferAccess.m_format.type == SIGNED_INT8)) {
                      pVVar2 = result.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                               (int)(uVar18 + iVar8 + uVar22 * iVar14);
                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_ = pVVar2->m_data[0];
                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_ = pVVar2->m_data[1];
                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = pVVar2->m_data[2];
                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_ = pVVar2->m_data[3];
                    }
                    else {
                      tcu::ConstPixelBufferAccess::getPixel
                                ((ConstPixelBufferAccess *)local_258,(int)&pixels,
                                 (int)local_280 + uVar18,(int)local_2e0);
                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_ = (float)local_258._0_4_;
                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_ = (float)local_258._4_4_;
                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = (float)local_258._8_4_;
                      data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_ = (float)local_258._12_4_;
                    }
                    if ((local_268->m_samples == 0) ||
                       (((uint)local_268->m_sampleMask >> (uVar18 & 0x1f) & 1) != 0)) {
                      local_258._0_4_ = 0x3f800000;
                      local_258._4_4_ = SNORM_INT8;
                      local_258._8_8_ = 0x3f80000000000000;
                      bVar9 = tcu::Vector<float,_4>::operator!=
                                        ((Vector<float,_4> *)&data,(Vector<float,_4> *)local_258);
                    }
                    else {
                      local_258._0_4_ = R;
                      local_258._4_4_ = 0x3f800000;
                      local_258._8_8_ = 0x3f80000000000000;
                      bVar9 = tcu::Vector<float,_4>::operator!=
                                        ((Vector<float,_4> *)&data,(Vector<float,_4> *)local_258);
                    }
                    bVar23 = bVar23 & (bVar9 ^ 1U);
                  }
                  pSVar21 = local_268;
                  iVar10 = (int)local_2e0;
                  iVar14 = (int)local_270 + 1;
                }
                local_278 = (ulong)(iVar8 + 0x10);
              }
              pcVar19 = *(code **)(local_2f0 + 0x78);
              iVar10 = (*((pSVar21->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])
                                 ();
              (*pcVar19)(0x8d40,iVar10);
              (**(code **)(lVar15 + 0x440))(1,&fbo);
              (**(code **)(lVar15 + 0xa0))(0x8d41,0);
              (**(code **)(lVar15 + 0x460))(1,&rbo);
              (**(code **)(lVar15 + 0xb8))(local_260,0);
              (**(code **)(lVar15 + 0x480))(1,&tex);
              pcVar17 = "Fail";
              if (bVar23 != 0) {
                pcVar17 = "Pass";
              }
              tcu::TestContext::setTestResult
                        ((pSVar21->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         (byte)~bVar23 & QP_TEST_RESULT_FAIL,pcVar17);
              std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              ~_Vector_base(&result.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           );
              tcu::TextureLevel::~TextureLevel(&results);
              return STOP;
            }
            pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar16,"Compile failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                       ,0x1ae);
            __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar16,"Compile failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                     ,0x169);
          __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar17 = "Test sample count greater than MAX_SAMPLES";
      }
    }
    else {
      (**(code **)(lVar15 + 0x880))(0x9100,GVar4,0x80a9,1,&maxSamples);
      if (this->m_samples <= maxSamples) goto LAB_00d7fbf9;
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar17 = "Test sample count greater than samples that the format supports";
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar17 = "GL_OES_sample_variables";
  }
LAB_00d7fbec:
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_NOT_SUPPORTED,pcVar17);
  return STOP;
}

Assistant:

SampleShadingMaskCase::IterateResult SampleShadingMaskCase::iterate()
{
	TestLog&			  log			  = m_testCtx.getLog();
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	bool				  isOk			  = true;
	bool				  supportsRgba32f = false;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_variables"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_variables");
		return STOP;
	}

	supportsRgba32f = isContextTypeGLCore(m_context.getRenderContext().getType()) ?
						  true :
						  (m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_float") ||
						   m_context.getContextInfo().isExtensionSupported("GL_ARB_color_buffer_float"));

	if (m_internalFormat == GL_RGBA32F && !supportsRgba32f)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Internalformat rgba32f not supported");
		return STOP;
	}

	GLint maxSamples;
	if (((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RG)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::R)) ||
		((m_texFormat.type == tcu::TextureFormat::HALF_FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)))
	{
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, m_internalFormat, GL_SAMPLES, 1, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED,
									"Test sample count greater than samples that the format supports");
			return STOP;
		}
	}
	else if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			 m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test sample count greater than MAX_INTEGER_SAMPLES");
			return STOP;
		}
	}
	else
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test sample count greater than MAX_SAMPLES");
			return STOP;
		}
	}

	// Create a multisample texture, or a regular texture if samples is zero.
	GLuint tex;
	gl.genTextures(1, &tex);
	GLenum target;
	if (m_samples)
	{
		target = GL_TEXTURE_2D_MULTISAMPLE;
		gl.bindTexture(target, tex);
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, m_samples, m_internalFormat, WIDTH, HEIGHT, GL_FALSE);
	}
	else
	{
		target = GL_TEXTURE_2D;
		gl.bindTexture(target, tex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_internalFormat, WIDTH, HEIGHT);
		if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8 || m_texFormat.type == tcu::TextureFormat::FLOAT)
		{
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		}
	}

	// Create a framebuffer with the texture attached and clear to "green".
	GLuint fboMs;
	gl.genFramebuffers(1, &fboMs);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fboMs);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, target, tex, 0);
	gl.viewport(0, 0, WIDTH, HEIGHT);
	if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8)
	{
		GLint color[4] = { 0, 1, 0, 1 };
		gl.clearBufferiv(GL_COLOR, 0, color);
	}
	else if (m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		GLuint color[4] = { 0, 1, 0, 1 };
		gl.clearBufferuiv(GL_COLOR, 0, color);
	}
	else
	{
		GLfloat color[4] = { 0.0f, 1.0f, 0.0f, 1.0f };
		gl.clearBufferfv(GL_COLOR, 0, color);
	}

	static deUint16 const quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	{
		// Draw a quad setting all samples to "red". We only expect "red"
		// to be written if the sample mask bit for that sample is 1.

		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main()\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SV_RQ}"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "uniform int u_sampleMask;\n"
								 "void main()\n"
								 "{\n"
								 "    for (int i = 0; i < (gl_NumSamples + 31) / 32; ++i) {\n"
								 "        gl_SampleMask[i] = u_sampleMask & gl_SampleMaskIn[i];\n"
								 "    }\n"
								 "    o_color = ${OUT_TYPE}(1, 0, 0, 1);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		static float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_sampleMask"), m_sampleMask);

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fboMs);

	GLsizei width = WIDTH * ((m_samples) ? m_samples : 1);

	GLuint rbo;
	gl.genRenderbuffers(1, &rbo);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, width, HEIGHT);

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
	gl.viewport(0, 0, width, HEIGHT);

	{
		// Resolve the multi-sample texture into a render-buffer sized such that
		// the width can hold all samples of a pixel.
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main(void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "uniform highp ${SAMPLER} u_tex;\n"
								 "uniform highp ${SAMPLER}MS u_texMS;\n"
								 "uniform int u_samples;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main(void)\n"
								 "{\n"
								 "    if (u_samples > 0) {\n"
								 "        ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n"
								 "        int sampleId = int(gl_FragCoord.x) % u_samples;\n"
								 "        o_color = texelFetch(u_texMS, coord, sampleId);\n"
								 "    } else {\n"
								 "        ivec2 coord = ivec2(gl_FragCoord.x, gl_FragCoord.y);\n"
								 "       o_color = texelFetch(u_tex, coord, 0);\n"
								 "    }\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		static float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_samples"), m_samples);
		if (m_samples > 0)
		{
			// only MS sampler needed, TU 1 is not used
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 1);
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_texMS"), 0);
		}
		else
		{
			// only non-MS sampler needed, TU 1 is not used
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 0);
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_texMS"), 1);
		}

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	tcu::TextureLevel	  results(m_texFormat, width, HEIGHT);
	tcu::PixelBufferAccess pixels = results.getAccess();
	std::vector<tcu::Vec4> result(pixels.getHeight() * pixels.getWidth());

	if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8)
	{
		std::vector<GLint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
	}
	else if (pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		std::vector<GLuint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_UNSIGNED_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
	}
	else
	{
		glu::readPixels(m_context.getRenderContext(), 0, 0, pixels);
	}

	for (int y = 0; y < HEIGHT; ++y)
	{
		for (int x = 0; x < WIDTH; ++x)
		{
			GLint samples = (m_samples) ? m_samples : 1;
			for (int sample = 0; sample < samples; ++sample)
			{
				tcu::Vec4 pixel;
				if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8 ||
					pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
				{
					pixel = result[y * WIDTH + x * samples + sample];
				}
				else
				{
					pixel = pixels.getPixel(x * samples + sample, y);
				}

				// Make sure only those samples where the sample mask bit is
				// non-zero have the "red" pixel values.
				if (!m_samples || (m_sampleMask & (1 << sample)))
				{
					if (pixel != tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f))
					{
						isOk = false;
					}
				}
				else
				{
					if (pixel != tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f))
					{
						isOk = false;
					}
				}
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	gl.deleteRenderbuffers(1, &rbo);

	gl.bindTexture(target, 0);
	gl.deleteTextures(1, &tex);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}